

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  SSL *ssl;
  proxy_info *ppVar2;
  _Bool *p_Var3;
  _Bool _Var4;
  ssl_connect_state sVar5;
  int iVar6;
  uint uVar7;
  curl_proxytype cVar8;
  CURLcode CVar9;
  int iVar10;
  uint uVar11;
  CURLcode CVar12;
  long lVar13;
  time_t tVar14;
  SSL_CIPHER *c;
  char *pcVar15;
  uint *puVar16;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  ulong uVar17;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar18;
  stack_st_X509 *psVar19;
  BIO *pBVar20;
  X509_NAME *pXVar21;
  size_t sVar22;
  undefined8 uVar23;
  ASN1_INTEGER *pAVar24;
  ASN1_STRING *pAVar25;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_GENERALIZEDTIME *pAVar26;
  ASN1_TIME *pAVar27;
  EVP_PKEY *pkey;
  X509 *pXVar28;
  OCSP_BASICRESP *pOVar29;
  int *piVar30;
  undefined8 extraout_RAX;
  undefined8 uVar31;
  X509_NAME_ENTRY *ne;
  void *__src;
  size_t sVar32;
  Curl_easy *pCVar33;
  X509_PUBKEY *pXVar34;
  BIGNUM *pBVar35;
  FILE *fp;
  X509 *pXVar36;
  X509_STORE *st;
  OCSP_SINGLERESP *single;
  long lVar37;
  undefined7 uVar38;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar39;
  size_t size;
  SSL_SESSION **ppSVar40;
  size_t size_00;
  ulong uVar41;
  ulong uVar42;
  ssl_connect_data *psVar43;
  char *pcVar44;
  connectdata *pcVar45;
  long lVar46;
  curl_socket_t readfd0;
  Curl_easy *pCVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  BIGNUM **buffer;
  long lVar52;
  Curl_easy *pCVar53;
  bool bVar54;
  char *ptr;
  X509 *x509;
  X509_ALGOR *palg;
  in_addr addr;
  EVP_PKEY *pri;
  char error_buffer [256];
  uchar protocols [128];
  ASN1_GENERALIZEDTIME *local_b78;
  OCSP_BASICRESP *local_b70;
  Curl_easy *local_b68;
  Curl_easy *local_b60;
  stack_st_X509 *local_b58;
  undefined8 local_b50;
  ulong local_b48;
  ASN1_GENERALIZEDTIME *local_b40;
  Curl_easy *local_b38;
  connectdata *local_b30;
  X509 *local_b28;
  Curl_easy *local_b20;
  BIO *local_b18;
  BIO *local_b10;
  uint local_b04;
  undefined8 local_b00;
  ASN1_GENERALIZEDTIME *local_af8;
  int *local_af0;
  ssl_connect_data *local_ae8;
  _Bool *local_ae0;
  long local_ad0;
  char *local_ac0;
  ASN1_GENERALIZEDTIME *local_ab8 [16];
  BIGNUM *local_a38 [64];
  SSL_SESSION *local_838;
  char acStack_830 [2048];
  
  local_b70 = (OCSP_BASICRESP *)
              CONCAT44(local_b70._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
  lVar13 = (long)sockindex;
  if (conn->ssl[lVar13].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_b28 = (X509 *)CONCAT44(local_b28._4_4_,sockindex);
  pCVar47 = conn->data;
  psVar43 = conn->ssl + lVar13;
  local_b60 = (Curl_easy *)CONCAT44(local_b60._4_4_,conn->sock[lVar13]);
  sVar5 = conn->ssl[lVar13].connecting_state;
  p_Var3 = done;
  local_ad0 = lVar13;
  if (sVar5 == ssl_connect_1) {
    tVar14 = Curl_timeleft(pCVar47,(timeval *)0x0,true);
    if (-1 < tVar14) {
      pCVar53 = conn->data;
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        local_b68 = (Curl_easy *)(conn->http_proxy).host.name;
        lVar52 = 0x520;
        lVar37 = 0x390;
        lVar46 = 0x398;
        lVar39 = 0x3a0;
        lVar51 = 0x550;
        lVar48 = 0x548;
        lVar49 = 0x380;
        lVar50 = 0x518;
      }
      else {
        local_b68 = (Curl_easy *)(conn->host).name;
        lVar52 = 0x470;
        lVar37 = 0x340;
        lVar46 = 0x348;
        lVar39 = 0x350;
        lVar51 = 0x4a0;
        lVar48 = 0x498;
        lVar49 = 0x330;
        lVar50 = 0x468;
      }
      local_b20 = (Curl_easy *)CONCAT44(local_b20._4_4_,conn->sock[local_ad0]);
      local_b18 = *(BIO **)((conn->chunk).hexbuffer + lVar46 + -0x20);
      local_b48 = *(undefined8 *)((long)pCVar53->sockets + lVar51 + -0x80);
      uVar17 = *(ulong *)((conn->chunk).hexbuffer + lVar49 + -0x20);
      local_b58 = *(stack_st_X509 **)((long)pCVar53->sockets + lVar48 + -0x80);
      local_b50 = *(undefined8 *)((conn->chunk).hexbuffer + lVar39 + -0x20);
      bVar1 = (conn->chunk).hexbuffer[lVar37 + -0x20];
      uVar23 = *(undefined8 *)((long)pCVar53->sockets + lVar52 + -0x80);
      local_b38 = pCVar47;
      local_b10 = (BIO *)(lVar13 * 5);
      local_ae8 = psVar43;
      local_ae0 = done;
      CVar9 = Curl_ossl_seed(pCVar53);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      local_b04 = (uint)bVar1;
      *(undefined8 *)((long)pCVar53->sockets + lVar50 + -0x80) = 1;
      local_b00 = uVar23;
      if (7 < uVar17) {
        local_b30 = conn;
        Curl_failf(pCVar53,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
        return CURLE_SSL_CONNECT_ERROR;
      }
      if ((0xf3UL >> (uVar17 & 0x3f) & 1) != 0) {
        local_b30 = conn;
        meth = (SSL_METHOD *)TLS_client_method();
        psVar43 = local_ae8;
        if ((SSL_CTX *)local_ae8->ctx != (SSL_CTX *)0x0) {
          SSL_CTX_free((SSL_CTX *)local_ae8->ctx);
        }
        ctx = SSL_CTX_new(meth);
        pcVar45 = local_b30;
        psVar43->ctx = (SSL_CTX *)ctx;
        if (ctx != (SSL_CTX *)0x0) {
          SSL_CTX_ctrl(ctx,0x21,0x10,(void *)0x0);
          if (((pCVar53->set).fdebug != (curl_debug_callback)0x0) &&
             ((pCVar53->set).verbose == true)) {
            SSL_CTX_set_msg_callback((SSL_CTX *)psVar43->ctx,ssl_tls_trace);
            SSL_CTX_ctrl((SSL_CTX *)psVar43->ctx,0x10,0,pcVar45);
          }
          CVar9 = (*(code *)(&DAT_0068dcbc + *(int *)(&DAT_0068dcbc + uVar17 * 4)))();
          return CVar9;
        }
        uVar17 = ERR_peek_error();
        ERR_error_string_n(uVar17,(char *)local_a38,0x100);
        Curl_failf(pCVar53,"SSL: couldn\'t create a context: %s",local_a38);
        return CURLE_OUT_OF_MEMORY;
      }
      if (uVar17 == 2) {
        pcVar44 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar44 = "OpenSSL was built without SSLv3 support";
      }
      local_b30 = conn;
      Curl_failf(pCVar53,pcVar44);
      return CURLE_NOT_BUILT_IN;
    }
LAB_006116e2:
    Curl_failf(pCVar47,"SSL connection timeout");
    return CURLE_OPERATION_TIMEDOUT;
  }
  while (local_ae0 = p_Var3, sVar5 - ssl_connect_2 < 3) {
    tVar14 = Curl_timeleft(pCVar47,(timeval *)0x0,true);
    if (tVar14 < 0) goto LAB_006116e2;
    sVar5 = conn->ssl[lVar13].connecting_state;
    if ((sVar5 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar5 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_b60;
      }
      readfd0 = -1;
      if (sVar5 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_b60;
      }
      if ((char)local_b70 != '\0') {
        tVar14 = 0;
      }
      iVar6 = Curl_socket_check(readfd0,-1,writefd,tVar14);
      if (iVar6 < 0) {
        puVar16 = (uint *)__errno_location();
        Curl_failf(pCVar47,"select/poll on SSL socket, errno: %d",(ulong)*puVar16);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar6 == 0) {
        if ((char)local_b70 != '\0') {
          *local_ae0 = false;
          return CURLE_OK;
        }
        goto LAB_006116e2;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar52 = 0x518, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar52 = 0x468;
    }
    pCVar53 = conn->data;
    ERR_clear_error();
    iVar6 = SSL_connect((SSL *)conn->ssl[lVar13].handle);
    if (iVar6 == 1) {
      conn->ssl[lVar13].connecting_state = ssl_connect_3;
      ssl = (SSL *)conn->ssl[lVar13].handle;
      pcVar44 = "";
      if (ssl != (SSL *)0x0) {
        iVar6 = SSL_version(ssl);
        pcVar44 = "TLSv1.3";
        switch(iVar6) {
        case 0x300:
          pcVar44 = "SSLv3";
          break;
        case 0x301:
          pcVar44 = "TLSv1.0";
          break;
        case 0x302:
          pcVar44 = "TLSv1.1";
          break;
        case 0x303:
          pcVar44 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar6 == 2) {
            pcVar44 = "SSLv2";
          }
          else {
            pcVar44 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar13].handle);
      pcVar15 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar53,"SSL connection using %s / %s\n",pcVar44,pcVar15);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar13].handle,&local_838,local_a38);
        if ((int)local_a38[0] == 0) {
          Curl_infof(pCVar53,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar53,"ALPN, server accepted to use %.*s\n",(ulong)local_a38[0] & 0xffffffff,
                     local_838);
          if (((int)local_a38[0] == 8) &&
             (lVar52._0_4_ = local_838->ssl_version, lVar52._4_4_ = local_838->key_arg_length,
             lVar52 == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar7 = SSL_get_error((SSL *)conn->ssl[lVar13].handle,iVar6);
      if (uVar7 == 3) {
        conn->ssl[lVar13].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar7 != 2) {
          memset(&local_838,0,0x100);
          conn->ssl[lVar13].connecting_state = ssl_connect_2;
          uVar17 = ERR_get_error();
          uVar11 = (uint)uVar17;
          if (((-1 < (int)uVar11) && ((uVar11 & 0xff800000) == 0xa000000)) &&
             ((uVar11 & 0x7fffff) == 0x86)) {
            lVar13 = SSL_get_verify_result((SSL *)conn->ssl[lVar13].handle);
            if (lVar13 == 0) {
              builtin_strncpy(acStack_830,"ificate verification failed",0x1c);
              local_838 = (SSL_SESSION *)0x74726563204c5353;
            }
            else {
              *(long *)((long)pCVar53->sockets + lVar52 + -0x80) = lVar13;
              pcVar44 = X509_verify_cert_error_string(lVar13);
              curl_msnprintf((char *)&local_838,0x100,"SSL certificate problem: %s",pcVar44);
            }
            CVar9 = CURLE_SSL_CACERT;
LAB_00611ca6:
            Curl_failf(pCVar53,"%s",&local_838);
            return CVar9;
          }
          ERR_error_string_n(uVar17,(char *)&local_838,0x100);
          CVar9 = CURLE_SSL_CONNECT_ERROR;
          if (uVar17 != 0) goto LAB_00611ca6;
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar54 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar2 = &conn->http_proxy;
            if (bVar54) {
              ppVar2 = (proxy_info *)&conn->host;
            }
            pcVar44 = (ppVar2->host).name;
            if (!bVar54) {
              lVar13 = conn->port;
              goto LAB_00612d6e;
            }
          }
          else {
            pcVar44 = (conn->host).name;
          }
          lVar13 = (long)conn->remote_port;
LAB_00612d6e:
          if (uVar7 < 0xb) {
            pcVar15 = (&PTR_anon_var_dwarf_17fada8_0078f840)[uVar7];
          }
          else {
            pcVar15 = "SSL_ERROR unknown";
          }
          Curl_failf(pCVar53,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar15,pcVar44,
                     lVar13);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar13].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar5 = conn->ssl[lVar13].connecting_state;
    p_Var3 = local_ae0;
    if (((char)local_b70 != '\0') && (sVar5 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  pcVar45 = conn;
  if (sVar5 == ssl_connect_3) {
    pCVar47 = conn->data;
    cVar8 = (conn->http_proxy).proxytype;
    if ((cVar8 == CURLPROXY_HTTPS) &&
       (iVar6 = conn->sock[1], conn->proxy_ssl[iVar6 != -1].state != ssl_connection_complete)) {
      if ((pCVar47->set).proxy_ssl.primary.sessionid != false) {
LAB_00611add:
        local_838 = (SSL_SESSION *)0x0;
        ses = SSL_get1_session((SSL *)conn->ssl[lVar13].handle);
        Curl_ssl_sessionid_lock(conn);
        _Var4 = Curl_ssl_getsessionid(conn,&local_838,(size_t *)0x0,(int)local_b28);
        if ((_Var4) || (local_838 == ses)) {
          if (_Var4) goto LAB_00611b4b;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar47,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,local_838);
LAB_00611b4b:
          CVar9 = Curl_ssl_addsessionid(conn,ses,0,(int)local_b28);
          if (CVar9 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            Curl_failf(pCVar47,"failed to store ssl session");
            return CVar9;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar8 = (conn->http_proxy).proxytype;
        goto LAB_00611cda;
      }
LAB_00611ce5:
      if (conn->proxy_ssl[iVar6 != -1].state == ssl_connection_complete) goto LAB_00611cfc;
      if ((conn->proxy_ssl_config).verifypeer == true) {
        pCVar47 = conn->data;
        pCVar53 = (Curl_easy *)0x518;
        goto LAB_00611d3a;
      }
      local_b50 = CONCAT71(local_b50._1_7_,(conn->proxy_ssl_config).verifyhost);
      pCVar47 = conn->data;
      pCVar53 = (Curl_easy *)0x518;
    }
    else {
      if ((pCVar47->set).ssl.primary.sessionid == true) goto LAB_00611add;
LAB_00611cda:
      if (cVar8 == CURLPROXY_HTTPS) {
        iVar6 = conn->sock[1];
        goto LAB_00611ce5;
      }
LAB_00611cfc:
      if ((conn->ssl_config).verifypeer == true) {
        pCVar47 = conn->data;
        pCVar53 = (Curl_easy *)0x468;
LAB_00611d3a:
        local_b50 = CONCAT71(local_b50._1_7_,1);
      }
      else {
        local_b50 = CONCAT71(local_b50._1_7_,(conn->ssl_config).verifyhost);
        pCVar47 = conn->data;
        pCVar53 = (Curl_easy *)0x468;
      }
    }
    pBVar18 = BIO_s_mem();
    local_b18 = BIO_new(pBVar18);
    if ((pCVar47->set).ssl.certinfo == true) {
      pCVar33 = conn->data;
      psVar19 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar13].handle);
      if (psVar19 != (stack_st_X509 *)0x0) {
        local_b58 = psVar19;
        iVar6 = OPENSSL_sk_num(psVar19);
        CVar9 = Curl_ssl_init_certinfo(pCVar33,iVar6);
        if (CVar9 == CURLE_OK) {
          local_b68 = pCVar47;
          local_b38 = pCVar53;
          pBVar18 = BIO_s_mem();
          pBVar20 = BIO_new(pBVar18);
          local_b60 = pCVar33;
          if (0 < iVar6) {
            iVar10 = 0;
            local_b48 = CONCAT44(local_b48._4_4_,iVar6);
            local_b30 = conn;
            local_b10 = pBVar20;
            local_ae8 = psVar43;
            do {
              local_b28 = (X509 *)OPENSSL_sk_value(local_b58,iVar10);
              local_af0 = (int *)0x0;
              pXVar21 = X509_get_subject_name(local_b28);
              X509_NAME_print_ex(pBVar20,pXVar21,0,0x82031f);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              pCVar47 = local_b60;
              Curl_ssl_push_certinfo_len(local_b60,iVar10,"Subject",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              pXVar21 = X509_get_issuer_name(local_b28);
              X509_NAME_print_ex(pBVar20,pXVar21,0,0x82031f);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              Curl_ssl_push_certinfo_len(pCVar47,iVar10,"Issuer",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              pXVar36 = local_b28;
              uVar23 = X509_get_version(local_b28);
              BIO_printf(pBVar20,"%lx",uVar23);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              local_b70 = (OCSP_BASICRESP *)CONCAT44(local_b70._4_4_,iVar10);
              Curl_ssl_push_certinfo_len(pCVar47,iVar10,"Version",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              pAVar24 = X509_get_serialNumber(pXVar36);
              if (pAVar24->type == 0x102) {
                BIO_puts(local_b10,"-");
              }
              pBVar20 = local_b10;
              if (0 < pAVar24->length) {
                lVar13 = 0;
                do {
                  BIO_printf(pBVar20,"%02x",(ulong)pAVar24->data[lVar13]);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < pAVar24->length);
              }
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              pCVar47 = local_b60;
              iVar6 = (int)local_b70;
              Curl_ssl_push_certinfo_len
                        (local_b60,(int)local_b70,"Serial Number",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              local_af8 = (ASN1_GENERALIZEDTIME *)0x0;
              pAVar25 = ASN1_STRING_new();
              if (pAVar25 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_af0,&local_af8,local_b28);
                X509_signature_print(pBVar20,(X509_ALGOR *)local_af8,pAVar25);
                ASN1_STRING_free(pAVar25);
                if (local_af8 != (ASN1_GENERALIZEDTIME *)0x0) {
                  i2a_ASN1_OBJECT(pBVar20,*(ASN1_OBJECT **)local_af8);
                  sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
                  Curl_ssl_push_certinfo_len
                            (pCVar47,iVar6,"Public Key Algorithm",(char *)local_b78,sVar22);
                  BIO_ctrl(pBVar20,1,0,(void *)0x0);
                }
              }
              uVar23 = X509_get0_extensions(local_b28);
              iVar6 = OPENSSL_sk_num(uVar23);
              pCVar47 = local_b60;
              if ((0 < iVar6) && (iVar6 = OPENSSL_sk_num(uVar23), 0 < iVar6)) {
                iVar6 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar23,iVar6);
                  pBVar18 = BIO_s_mem();
                  pBVar20 = BIO_new(pBVar18);
                  pCVar47 = local_b60;
                  if (pBVar20 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_ab8,0x80,a);
                  iVar10 = X509V3_EXT_print(pBVar20,ex,0,0);
                  if (iVar10 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar20,v);
                  }
                  BIO_ctrl(pBVar20,0x73,0,&local_b40);
                  uVar17._0_4_ = local_b40->length;
                  uVar17._4_4_ = local_b40->type;
                  if (uVar17 != 0) {
                    buffer = local_a38;
                    uVar41 = 0;
                    pAVar26 = local_b40;
                    do {
                      bVar54 = pAVar26->data[uVar41] == '\n';
                      pcVar44 = "";
                      if (bVar54) {
                        pcVar44 = ", ";
                      }
                      uVar41 = bVar54 + uVar41;
                      uVar42 = uVar41;
                      for (; uVar41 < uVar17; uVar41 = uVar41 + 1) {
                        if (pAVar26->data[uVar41] != ' ') {
                          iVar10 = curl_msnprintf((char *)buffer,(long)&local_838 - (long)buffer,
                                                  "%s%c",pcVar44);
                          buffer = (BIGNUM **)((long)buffer + (long)iVar10);
                          uVar17._0_4_ = local_b40->length;
                          uVar17._4_4_ = local_b40->type;
                          pAVar26 = local_b40;
                          uVar42 = uVar41;
                          break;
                        }
                        uVar42 = uVar17;
                      }
                      uVar41 = uVar42 + 1;
                    } while (uVar41 < uVar17);
                  }
                  pCVar47 = local_b60;
                  Curl_ssl_push_certinfo
                            (local_b60,(int)local_b70,(char *)local_ab8,(char *)local_a38);
                  BIO_free(pBVar20);
                  iVar6 = iVar6 + 1;
                  iVar10 = OPENSSL_sk_num(uVar23);
                } while (iVar6 < iVar10);
              }
              pXVar36 = local_b28;
              pAVar27 = (ASN1_TIME *)X509_get0_notBefore(local_b28);
              pBVar20 = local_b10;
              ASN1_TIME_print(local_b10,pAVar27);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              iVar6 = (int)local_b70;
              Curl_ssl_push_certinfo_len
                        (pCVar47,(int)local_b70,"Start date",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              pAVar27 = (ASN1_TIME *)X509_get0_notAfter(pXVar36);
              ASN1_TIME_print(pBVar20,pAVar27);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              Curl_ssl_push_certinfo_len(pCVar47,iVar6,"Expire date",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              pkey = X509_get_pubkey(pXVar36);
              psVar43 = local_ae8;
              if (pkey == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar47,"   Unable to load public key\n");
              }
              else {
                iVar6 = EVP_PKEY_get_id(pkey);
                if (iVar6 == 0x74) {
                  uVar23 = EVP_PKEY_get0_DSA(pkey);
                  DSA_get0_pqg(uVar23,local_a38,local_ab8,&local_b40);
                  DSA_get0_key(uVar23,&local_af8,0);
                  pCVar47 = local_b60;
                  iVar6 = (int)local_b70;
                  pubkey_show(local_b60,(BIO *)pBVar20,(int)local_b70,"dsa","p",
                              (BIGNUM *)local_a38[0]);
                  pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,"dsa","q",(BIGNUM *)local_ab8[0]);
                  pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,"dsa","g",(BIGNUM *)local_b40);
                  pcVar44 = "dsa";
LAB_00612561:
                  pcVar15 = "pub_key";
                  pAVar26 = local_af8;
LAB_00612568:
                  pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,pcVar44,pcVar15,(BIGNUM *)pAVar26);
                }
                else {
                  if (iVar6 == 0x1c) {
                    uVar23 = EVP_PKEY_get0_DH(pkey);
                    DH_get0_pqg(uVar23,local_a38,local_ab8,&local_b40);
                    DH_get0_key(uVar23,&local_af8,0);
                    pCVar47 = local_b60;
                    iVar6 = (int)local_b70;
                    pubkey_show(local_b60,(BIO *)pBVar20,(int)local_b70,"dh","p",
                                (BIGNUM *)local_a38[0]);
                    pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,"dh","q",(BIGNUM *)local_ab8[0]);
                    pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,"dh","g",(BIGNUM *)local_b40);
                    pcVar44 = "dh";
                    goto LAB_00612561;
                  }
                  if (iVar6 == 6) {
                    uVar23 = EVP_PKEY_get0_RSA(pkey);
                    RSA_get0_key(uVar23,local_a38,local_ab8,0);
                    BN_print(pBVar20,local_a38[0]);
                    sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
                    pCVar47 = local_b60;
                    iVar6 = (int)local_b70;
                    Curl_ssl_push_certinfo_len
                              (local_b60,(int)local_b70,"RSA Public Key",(char *)local_b78,sVar22);
                    BIO_ctrl(pBVar20,1,0,(void *)0x0);
                    pubkey_show(pCVar47,(BIO *)pBVar20,iVar6,"rsa","n",(BIGNUM *)local_a38[0]);
                    pcVar44 = "rsa";
                    pcVar15 = "e";
                    pAVar26 = local_ab8[0];
                    goto LAB_00612568;
                  }
                }
                EVP_PKEY_free(pkey);
                pCVar47 = local_b60;
              }
              pBVar20 = local_b10;
              pcVar45 = local_b30;
              if (local_af0 != (int *)0x0) {
                if (0 < *local_af0) {
                  lVar13 = 0;
                  do {
                    BIO_printf(pBVar20,"%02x:",(ulong)*(byte *)(*(long *)(local_af0 + 2) + lVar13));
                    lVar13 = lVar13 + 1;
                  } while (lVar13 < *local_af0);
                }
                sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
                Curl_ssl_push_certinfo_len
                          (pCVar47,(int)local_b70,"Signature",(char *)local_b78,sVar22);
                BIO_ctrl(pBVar20,1,0,(void *)0x0);
                psVar43 = local_ae8;
              }
              pBVar20 = local_b10;
              PEM_write_bio_X509(local_b10,local_b28);
              sVar22 = BIO_ctrl(pBVar20,3,0,&local_b78);
              iVar10 = (int)local_b70;
              Curl_ssl_push_certinfo_len(pCVar47,(int)local_b70,"Cert",(char *)local_b78,sVar22);
              BIO_ctrl(pBVar20,1,0,(void *)0x0);
              iVar10 = iVar10 + 1;
            } while (iVar10 != (int)local_b48);
          }
          BIO_free(pBVar20);
          pCVar47 = local_b68;
          pCVar53 = local_b38;
        }
      }
    }
    pXVar28 = (X509 *)SSL_get1_peer_certificate(psVar43->handle);
    psVar43->server_cert = pXVar28;
    if (pXVar28 == (X509 *)0x0) {
      BIO_free(local_b18);
      if ((char)local_b50 != '\0') {
        Curl_failf(pCVar47,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((pcVar45->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar44 = "Proxy";
        if (conn->proxy_ssl[pcVar45->sock[1] != -1].state == ssl_connection_complete) {
          pcVar44 = "Server";
        }
      }
      else {
        pcVar44 = "Server";
      }
      Curl_infof(pCVar47,"%s certificate:\n",pcVar44);
      pXVar21 = X509_get_subject_name((X509 *)psVar43->server_cert);
      iVar6 = x509_name_oneline((X509_NAME *)pXVar21,(char *)&local_838,size);
      ppSVar40 = (SSL_SESSION **)"[NONE]";
      if (iVar6 == 0) {
        ppSVar40 = &local_838;
      }
      Curl_infof(pCVar47," subject: %s\n",ppSVar40);
      pAVar27 = (ASN1_TIME *)X509_get0_notBefore(psVar43->server_cert);
      pBVar20 = local_b18;
      ASN1_TIME_print(local_b18,pAVar27);
      lVar13 = BIO_ctrl(pBVar20,3,0,&local_ac0);
      Curl_infof(pCVar47," start date: %.*s\n",lVar13);
      BIO_ctrl(pBVar20,1,0,(void *)0x0);
      pAVar27 = (ASN1_TIME *)X509_get0_notAfter(psVar43->server_cert);
      ASN1_TIME_print(pBVar20,pAVar27);
      lVar13 = BIO_ctrl(pBVar20,3,0,&local_ac0);
      Curl_infof(pCVar47," expire date: %.*s\n",lVar13);
      BIO_ctrl(pBVar20,1,0,(void *)0x0);
      BIO_free(pBVar20);
      if (((pcVar45->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[pcVar45->sock[1] != -1].state != ssl_connection_complete)) {
        if ((pcVar45->proxy_ssl_config).verifyhost == true) {
          pXVar36 = (X509 *)psVar43->server_cert;
          local_b20 = pcVar45->data;
          lVar13 = 0x168;
          lVar52 = 0x160;
LAB_00612891:
          local_b18 = *(BIO **)((pcVar45->chunk).hexbuffer + lVar52 + -0x20);
          local_b00 = *(undefined8 *)((pcVar45->chunk).hexbuffer + lVar13 + -0x20);
          local_b38 = pCVar53;
          iVar6 = inet_pton(2,(char *)local_b18,local_ab8);
          local_b10 = (BIO *)CONCAT44(local_b10._4_4_,iVar6);
          uVar23 = 0;
          pOVar29 = (OCSP_BASICRESP *)X509_get_ext_d2i(pXVar36,0x55,(int *)0x0,(int *)0x0);
          if (pOVar29 != (OCSP_BASICRESP *)0x0) {
            local_b68 = pCVar47;
            iVar10 = OPENSSL_sk_num(pOVar29);
            local_b60 = (Curl_easy *)CONCAT44(local_b60._4_4_,iVar10);
            if (0 < iVar10) {
              local_b28 = (X509 *)CONCAT44(local_b28._4_4_,(uint)(iVar6 != 0) * 5 + 2);
              local_b58 = (stack_st_X509 *)((ulong)local_b58 & 0xffffffff00000000);
              local_b48 = local_b48 & 0xffffffff00000000;
              uVar31 = 0;
              iVar6 = 0;
              local_b70 = pOVar29;
LAB_00612929:
              local_b04 = (uint)uVar31;
              do {
                piVar30 = (int *)OPENSSL_sk_value(local_b70,iVar6);
                iVar10 = *piVar30;
                uVar38 = (undefined7)((ulong)uVar23 >> 8);
                if (iVar10 == 2) {
                  uVar23 = CONCAT71(uVar38,1);
                  local_b58 = (stack_st_X509 *)CONCAT44(local_b58._4_4_,(int)uVar23);
                }
                else if (iVar10 == 7) {
                  uVar23 = CONCAT71(uVar38,1);
                  local_b48 = CONCAT44(local_b48._4_4_,(int)uVar23);
                }
                if (iVar10 == (int)local_b28) {
                  pcVar44 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar30 + 2));
                  iVar10 = ASN1_STRING_length(*(ASN1_STRING **)(piVar30 + 2));
                  if ((int)local_b10 == 0) {
                    sVar32 = strlen(pcVar44);
                    if ((sVar32 == (long)iVar10) &&
                       (iVar10 = Curl_cert_hostcheck(pcVar44,(char *)local_b18), iVar10 != 0)) {
                      Curl_infof(local_b20," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                                 local_b00);
                      goto LAB_006130bf;
                    }
                  }
                  else if ((iVar10 == 4) &&
                          (iVar10 = bcmp(pcVar44,local_ab8,(long)iVar10), iVar10 == 0))
                  goto LAB_006129d4;
                }
                iVar6 = iVar6 + 1;
                if ((curl_socket_t)local_b60 <= iVar6) {
                  GENERAL_NAMES_free((GENERAL_NAMES *)local_b70);
                  uVar23 = local_b00;
                  pCVar33 = local_b20;
                  pCVar47 = local_b68;
                  pCVar53 = local_b38;
                  if ((local_b04 & 1) != 0) goto LAB_0061319f;
                  if ((((byte)local_b58 | (byte)local_b48) & 1) == 0) goto LAB_00612e05;
                  Curl_infof(local_b20," subjectAltName does not match %s\n",local_b00);
                  Curl_failf(pCVar33,
                             "SSL: no alternative certificate subject name matches target host name \'%s\'"
                             ,uVar23);
                  CVar9 = CURLE_PEER_FAILED_VERIFICATION;
                  goto LAB_00613189;
                }
              } while( true );
            }
            GENERAL_NAMES_free((GENERAL_NAMES *)pOVar29);
            pCVar47 = local_b68;
          }
LAB_00612e05:
          local_a38[0] = (BIGNUM *)0x66eafa;
          pXVar21 = X509_get_subject_name(pXVar36);
          if (pXVar21 == (X509_NAME *)0x0) {
LAB_006130ee:
            if (local_a38[0] == (BIGNUM *)0x66eafa) {
              local_a38[0] = (BIGNUM *)0x0;
              goto LAB_00613145;
            }
            if (local_a38[0] == (BIGNUM *)0x0) goto LAB_00613145;
            iVar6 = Curl_cert_hostcheck((char *)local_a38[0],(char *)local_b18);
            if (iVar6 == 0) {
              Curl_failf(local_b20,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,local_a38[0]);
              goto LAB_00613158;
            }
            CVar9 = CURLE_OK;
            Curl_infof(local_b20," common name: %s (matched)\n");
          }
          else {
            iVar6 = -1;
            do {
              iVar10 = iVar6;
              iVar6 = X509_NAME_get_index_by_NID(pXVar21,0xd,iVar10);
            } while (-1 < iVar6);
            if (iVar10 < 0) goto LAB_006130ee;
            ne = X509_NAME_get_entry(pXVar21,iVar10);
            pAVar25 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar25 == (ASN1_STRING *)0x0) goto LAB_006130ee;
            iVar6 = ASN1_STRING_type(pAVar25);
            if (iVar6 == 0xc) {
              uVar7 = ASN1_STRING_length(pAVar25);
              if ((int)uVar7 < 0) {
                pBVar35 = (BIGNUM *)0x66eafa;
              }
              else {
                pBVar35 = (BIGNUM *)
                          CRYPTO_malloc(uVar7 + 1,
                                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                        ,0x4f7);
                local_a38[0] = pBVar35;
                if (pBVar35 == (BIGNUM *)0x0) goto LAB_00613145;
                __src = (void *)ASN1_STRING_get0_data(pAVar25);
                memcpy(pBVar35,__src,(ulong)uVar7);
                *(uchar *)((long)&pBVar35->d + (ulong)uVar7) = '\0';
              }
LAB_006130d5:
              sVar32 = strlen((char *)pBVar35);
              uVar11 = curlx_uztosi(sVar32);
              if (uVar11 == uVar7) goto LAB_006130ee;
              Curl_failf(local_b20,"SSL: illegal cert name field");
              CVar9 = CURLE_PEER_FAILED_VERIFICATION;
              if (local_a38[0] == (BIGNUM *)0x66eafa) {
                CVar9 = CURLE_PEER_FAILED_VERIFICATION;
                goto LAB_00613189;
              }
              goto LAB_0061316e;
            }
            uVar7 = ASN1_STRING_to_UTF8((uchar **)local_a38,pAVar25);
            pBVar35 = local_a38[0];
            if (local_a38[0] != (BIGNUM *)0x0) goto LAB_006130d5;
LAB_00613145:
            Curl_failf(local_b20,"SSL: unable to obtain common name from peer certificate");
LAB_00613158:
            CVar9 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_0061316e:
          pCVar53 = local_b38;
          if (local_a38[0] != (BIGNUM *)0x0) {
            CRYPTO_free(local_a38[0]);
          }
          if (CVar9 != CURLE_OK) {
LAB_00613189:
            X509_free((X509 *)psVar43->server_cert);
            psVar43->server_cert = (X509 *)0x0;
            return CVar9;
          }
        }
      }
      else if ((pcVar45->ssl_config).verifyhost != false) {
        pXVar36 = (X509 *)psVar43->server_cert;
        local_b20 = pcVar45->data;
        lVar13 = 0xe0;
        lVar52 = 0xd8;
        goto LAB_00612891;
      }
LAB_0061319f:
      pXVar21 = X509_get_issuer_name((X509 *)psVar43->server_cert);
      iVar6 = x509_name_oneline((X509_NAME *)pXVar21,(char *)&local_838,size_00);
      if (iVar6 == 0) {
        Curl_infof(pCVar47," issuer: %s\n",&local_838);
        if (((pcVar45->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[pcVar45->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar44 = (pCVar47->set).proxy_ssl.issuercert;
        }
        else {
          pcVar44 = (pCVar47->set).ssl.issuercert;
        }
        if (pcVar44 != (char *)0x0) {
          fp = fopen64(pcVar44,"r");
          if (fp == (FILE *)0x0) {
            if ((char)local_b50 != '\0') {
              if (((pcVar45->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar13 = 0x528,
                 conn->proxy_ssl[pcVar45->sock[1] != -1].state == ssl_connection_complete)) {
                lVar13 = 0x478;
              }
              Curl_failf(pCVar47,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)pCVar47->sockets + lVar13 + -0x80));
            }
            pXVar36 = (X509 *)psVar43->server_cert;
LAB_00613573:
            X509_free(pXVar36);
            psVar43->server_cert = (X509 *)0x0;
            return CURLE_SSL_ISSUER_ERROR;
          }
          pXVar36 = PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar36 == (X509 *)0x0) {
            if ((char)local_b50 != '\0') {
              if (((pcVar45->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar13 = 0x528,
                 conn->proxy_ssl[pcVar45->sock[1] != -1].state == ssl_connection_complete)) {
                lVar13 = 0x478;
              }
              Curl_failf(pCVar47,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)pCVar47->sockets + lVar13 + -0x80));
            }
            X509_free((X509 *)psVar43->server_cert);
            X509_free((X509 *)0x0);
            fclose(fp);
            return CURLE_SSL_ISSUER_ERROR;
          }
          fclose(fp);
          iVar6 = X509_check_issued(pXVar36,(X509 *)psVar43->server_cert);
          if (iVar6 != 0) {
            if ((char)local_b50 != '\0') {
              if (((pcVar45->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar13 = 0x528,
                 conn->proxy_ssl[pcVar45->sock[1] != -1].state == ssl_connection_complete)) {
                lVar13 = 0x478;
              }
              Curl_failf(pCVar47,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)pCVar47->sockets + lVar13 + -0x80));
            }
            X509_free((X509 *)psVar43->server_cert);
            goto LAB_00613573;
          }
          if (((pcVar45->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar13 = 0x528,
             conn->proxy_ssl[pcVar45->sock[1] != -1].state == ssl_connection_complete)) {
            lVar13 = 0x478;
          }
          Curl_infof(pCVar47," SSL certificate issuer check ok (%s)\n",
                     *(undefined8 *)((long)pCVar47->sockets + lVar13 + -0x80));
          X509_free(pXVar36);
        }
        lVar13 = SSL_get_verify_result((SSL *)psVar43->handle);
        *(long *)((long)pCVar47->sockets + (long)pCVar53 + -0x80) = lVar13;
        if (lVar13 == 0) {
          CVar9 = CURLE_OK;
          Curl_infof(pCVar47," SSL certificate verify ok.\n");
        }
        else {
          if (((pcVar45->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[pcVar45->sock[1] != -1].state != ssl_connection_complete)) {
            if ((pcVar45->proxy_ssl_config).verifypeer == false) {
LAB_0061387f:
              pcVar44 = X509_verify_cert_error_string(lVar13);
              CVar9 = CURLE_OK;
              Curl_infof(pCVar47," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar44,lVar13);
              goto LAB_006131da;
            }
          }
          else if ((pcVar45->ssl_config).verifypeer != true) goto LAB_0061387f;
          CVar9 = CURLE_PEER_FAILED_VERIFICATION;
          if ((char)local_b50 != '\0') {
            pcVar44 = X509_verify_cert_error_string(lVar13);
            Curl_failf(pCVar47,"SSL certificate verify result: %s (%ld)",pcVar44,lVar13);
          }
        }
      }
      else {
        CVar9 = CURLE_SSL_CONNECT_ERROR;
        if ((char)local_b50 != '\0') {
          Curl_failf(pCVar47,"SSL: couldn\'t get X509-issuer name!");
        }
      }
LAB_006131da:
      cVar8 = (pcVar45->http_proxy).proxytype;
      if ((cVar8 == CURLPROXY_HTTPS) &&
         (iVar6 = pcVar45->sock[1], conn->proxy_ssl[iVar6 != -1].state != ssl_connection_complete))
      {
        if ((pcVar45->proxy_ssl_config).verifystatus == false) {
          CVar12 = CURLE_OK;
          if ((char)local_b50 != '\0') {
            CVar12 = CVar9;
          }
          goto LAB_00613325;
        }
LAB_00613293:
        pCVar53 = pcVar45->data;
        lVar13 = SSL_ctrl((SSL *)psVar43->handle,0x46,0,local_a38);
        if (local_a38[0] == (BIGNUM *)0x0) {
          pcVar44 = "No OCSP response received";
LAB_006134f4:
          pCVar33 = (Curl_easy *)0x0;
LAB_006134f7:
          Curl_failf(pCVar53,pcVar44);
LAB_00613501:
          OCSP_RESPONSE_free((OCSP_RESPONSE *)pCVar33);
          CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          pCVar33 = (Curl_easy *)d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)local_a38,lVar13)
          ;
          if (pCVar33 == (Curl_easy *)0x0) {
            pcVar44 = "Invalid OCSP response";
            goto LAB_006134f4;
          }
          uVar7 = OCSP_response_status((OCSP_RESPONSE *)pCVar33);
          if (uVar7 != 0) {
            pcVar44 = OCSP_response_status_str((long)(int)uVar7);
            Curl_failf(pCVar53,"Invalid OCSP response status: %s (%d)",pcVar44,(ulong)uVar7);
            goto LAB_00613501;
          }
          pOVar29 = OCSP_response_get1_basic((OCSP_RESPONSE *)pCVar33);
          if (pOVar29 == (OCSP_BASICRESP *)0x0) {
            pcVar44 = "Invalid OCSP response";
            goto LAB_006134f7;
          }
          local_b68 = pCVar47;
          local_b70 = (OCSP_BASICRESP *)SSL_get_peer_cert_chain((SSL *)psVar43->handle);
          st = SSL_CTX_get_cert_store((SSL_CTX *)psVar43->ctx);
          iVar6 = OCSP_basic_verify(pOVar29,(stack_st_X509 *)local_b70,st,0);
          local_b70 = pOVar29;
          if (iVar6 < 1) {
            bVar54 = false;
            Curl_failf(pCVar53,"OCSP response verification failed");
            CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            iVar6 = OCSP_resp_count(pOVar29);
            if (0 < iVar6) {
              iVar6 = 0;
              pOVar29 = local_b70;
              local_b60 = pCVar33;
              local_b30 = pcVar45;
              do {
                single = OCSP_resp_get0(pOVar29,iVar6);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar7 = OCSP_single_get0_status
                                    (single,(int *)&local_af0,local_ab8,&local_b40,&local_b78);
                  iVar10 = OCSP_check_validity(local_b40,local_b78,300,-1);
                  if (iVar10 == 0) {
                    Curl_failf(pCVar53,"OCSP response has expired");
                  }
                  else {
                    pcVar44 = OCSP_cert_status_str((long)(int)uVar7);
                    Curl_infof(pCVar53,"SSL certificate status: %s (%d)\n",pcVar44,(ulong)uVar7);
                    if (uVar7 != 2) {
                      pcVar45 = local_b30;
                      pOVar29 = local_b70;
                      pCVar33 = local_b60;
                      if (uVar7 != 1) goto LAB_006136c3;
                      pcVar44 = OCSP_crl_reason_str((long)(int)local_af0);
                      Curl_failf(pCVar53,"SSL certificate revocation reason: %s (%d)",pcVar44,
                                 (ulong)local_af0 & 0xffffffff);
                    }
                  }
                  CVar12 = CURLE_SSL_INVALIDCERTSTATUS;
                  bVar54 = false;
                  pcVar45 = local_b30;
                  pCVar33 = local_b60;
                  goto LAB_00614118;
                }
LAB_006136c3:
                iVar6 = iVar6 + 1;
                iVar10 = OCSP_resp_count(pOVar29);
              } while (iVar6 < iVar10);
            }
            CVar12 = CURLE_OK;
            bVar54 = true;
          }
LAB_00614118:
          pCVar47 = local_b68;
          OCSP_BASICRESP_free(local_b70);
          OCSP_RESPONSE_free((OCSP_RESPONSE *)pCVar33);
          if (bVar54) {
            cVar8 = (pcVar45->http_proxy).proxytype;
            CVar9 = CURLE_OK;
            goto LAB_00613213;
          }
        }
        X509_free((X509 *)psVar43->server_cert);
        psVar43->server_cert = (X509 *)0x0;
      }
      else {
        if ((pcVar45->ssl_config).verifystatus == true) goto LAB_00613293;
LAB_00613213:
        CVar12 = CURLE_OK;
        if ((char)local_b50 != '\0') {
          CVar12 = CVar9;
        }
        lVar13 = 0x718;
        if (cVar8 == CURLPROXY_HTTPS) {
          iVar6 = pcVar45->sock[1];
LAB_00613325:
          lVar13 = (ulong)(conn->proxy_ssl[iVar6 != -1].state != ssl_connection_complete) * 8 +
                   0x718;
        }
        pcVar44 = *(char **)((long)pCVar47->sockets + lVar13 + -0x80);
        local_ac0 = pcVar44;
        if ((CVar12 == CURLE_OK) && (pcVar44 != (char *)0x0)) {
          pXVar28 = psVar43->server_cert;
          local_b68 = pCVar47;
          local_b30 = pcVar45;
          if (pXVar28 == (X509 *)0x0) {
LAB_006138b2:
            CVar12 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar28);
            uVar7 = i2d_X509_PUBKEY(pXVar34,(uchar **)0x0);
            if ((int)uVar7 < 1) goto LAB_006138b2;
            uVar17 = (ulong)uVar7;
            pBVar35 = (BIGNUM *)(*Curl_cmalloc)(uVar17);
            local_a38[0] = pBVar35;
            if (pBVar35 == (BIGNUM *)0x0) goto LAB_006138b2;
            pXVar34 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar28);
            uVar11 = i2d_X509_PUBKEY(pXVar34,(uchar **)local_a38);
            if (((long)local_a38[0] - (long)pBVar35 != uVar17 || uVar7 != uVar11) ||
                local_a38[0] == (BIGNUM *)0x0) {
              (*Curl_cfree)(pBVar35);
              goto LAB_006138b2;
            }
            CVar12 = Curl_pin_peer_pubkey(local_b68,pcVar44,(uchar *)pBVar35,uVar17);
            (*Curl_cfree)(pBVar35);
            if (CVar12 == CURLE_OK) {
              CVar12 = CURLE_OK;
              pcVar45 = local_b30;
              goto LAB_006138d0;
            }
          }
          pcVar45 = local_b30;
          Curl_failf(local_b68,"SSL: public key does not match pinned public key!");
        }
LAB_006138d0:
        X509_free((X509 *)psVar43->server_cert);
        psVar43->server_cert = (X509 *)0x0;
        psVar43->connecting_state = ssl_connect_done;
      }
      if (CVar12 != CURLE_OK) {
        return CVar12;
      }
    }
  }
  else if (sVar5 != ssl_connect_done) {
    _Var4 = false;
    goto LAB_00611956;
  }
  psVar43->state = ssl_connection_complete;
  pcVar45->recv[local_ad0] = ossl_recv;
  pcVar45->send[local_ad0] = ossl_send;
  _Var4 = true;
LAB_00611956:
  *local_ae0 = _Var4;
  psVar43->connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_006129d4:
  Curl_infof(local_b20," subjectAltName: host \"%s\" matched cert\'s IP address!\n",local_b00);
  iVar6 = iVar6 + 1;
  uVar31 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if ((curl_socket_t)local_b60 <= iVar6) goto LAB_006130bf;
  goto LAB_00612929;
LAB_006130bf:
  GENERAL_NAMES_free((GENERAL_NAMES *)local_b70);
  pCVar47 = local_b68;
  pCVar53 = local_b38;
  goto LAB_0061319f;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}